

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_GetPeginWitnessData_Test::TestBody
          (cfdcapi_elements_transaction_GetPeginWitnessData_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  char **unaff_retaddr;
  uint32_t in_stack_00000008;
  uint32_t in_stack_0000000c;
  char *in_stack_00000010;
  void *in_stack_00000018;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  char *str_buffer;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *stack_data;
  uint32_t pegin_count;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffc08;
  AssertionResult *in_stack_fffffffffffffc10;
  CfdErrorCode *in_stack_fffffffffffffc18;
  AssertionResult *pAVar3;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  void **in_stack_fffffffffffffc28;
  void *in_stack_fffffffffffffc48;
  char **in_stack_fffffffffffffca0;
  AssertionResult *in_stack_fffffffffffffca8;
  AssertHelper local_290;
  Message local_288;
  undefined4 local_27c;
  AssertionResult local_278;
  AssertHelper local_268;
  Message local_260;
  AssertionResult local_258;
  AssertHelper local_248;
  Message local_240;
  undefined4 local_234;
  AssertionResult local_230;
  char *local_220;
  AssertHelper local_218;
  Message local_210;
  AssertionResult local_208;
  AssertHelper local_1f8;
  Message local_1f0;
  undefined4 local_1e4;
  AssertionResult local_1e0;
  AssertHelper local_1d0;
  Message local_1c8;
  AssertionResult local_1c0;
  AssertHelper local_1b0;
  Message local_1a8;
  undefined4 local_19c;
  AssertionResult local_198;
  AssertHelper local_188;
  Message local_180;
  AssertionResult local_178;
  AssertHelper local_168;
  Message local_160;
  undefined4 local_154;
  AssertionResult local_150;
  AssertHelper local_140;
  Message local_138;
  AssertionResult local_130;
  AssertHelper local_120;
  Message local_118;
  undefined4 local_10c;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff00;
  uint32_t in_stack_ffffffffffffff0c;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  AssertionResult local_e0;
  AssertHelper local_d0;
  Message local_c8;
  undefined4 local_bc;
  AssertionResult local_b8;
  char *local_a8;
  undefined4 local_9c;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffc28);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffc28,
             (char *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
             in_stack_fffffffffffffc18,(int *)in_stack_fffffffffffffc10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3517da);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x280,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x35183d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x351892);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,(type *)0x3518c6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x281,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3519c2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x351a3d);
  local_9c = 0;
  local_a8 = (char *)0x0;
  local_14 = CfdGetConfidentialTxInPeginWitnessCount
                       ((void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                        (char *)in_stack_ffffffffffffff10.ptr_,in_stack_ffffffffffffff0c,
                        (uint32_t *)in_stack_ffffffffffffff00.ptr_);
  local_bc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffc28,
             (char *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
             in_stack_fffffffffffffc18,(int *)in_stack_fffffffffffffc10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x351b26);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x289,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message((Message *)0x351b89);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x351bde);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)in_stack_fffffffffffffc28,
             (char *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
             in_stack_fffffffffffffc18,(uint *)in_stack_fffffffffffffc10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffff10);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x351c8b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x28a,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff08,(Message *)&stack0xffffffffffffff10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff08);
    testing::Message::~Message((Message *)0x351cee);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x351d46);
  if (local_14 == 0) {
    local_14 = CfdGetConfidentialTxInPeginWitness
                         (in_stack_00000018,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                          unaff_retaddr);
    local_10c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc28,
               (char *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
               in_stack_fffffffffffffc18,(int *)in_stack_fffffffffffffc10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffef8);
    if (!bVar1) {
      testing::Message::Message(&local_118);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x351e28);
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x28f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_120,&local_118);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      testing::Message::~Message((Message *)0x351e8b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x351ee0);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_130,"\"00e40b5402000000\"","stack_data","00e40b5402000000",
                 local_a8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
      if (!bVar1) {
        testing::Message::Message(&local_138);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x351f8f);
        testing::internal::AssertHelper::AssertHelper
                  (&local_140,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x291,pcVar2);
        testing::internal::AssertHelper::operator=(&local_140,&local_138);
        testing::internal::AssertHelper::~AssertHelper(&local_140);
        testing::Message::~Message((Message *)0x351ff2);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x352047);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffc18);
      local_a8 = (char *)0x0;
    }
  }
  if (local_14 == 0) {
    local_14 = CfdGetConfidentialTxInPeginWitness
                         (in_stack_00000018,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                          unaff_retaddr);
    local_154 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc28,
               (char *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
               in_stack_fffffffffffffc18,(int *)in_stack_fffffffffffffc10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_150);
    if (!bVar1) {
      testing::Message::Message(&local_160);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x352146);
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x299,pcVar2);
      testing::internal::AssertHelper::operator=(&local_168,&local_160);
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      testing::Message::~Message((Message *)0x3521a9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3521fe);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_178,"\"00e40b5402000000\"","stack_data","00e40b5402000000",
                 local_a8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
      if (!bVar1) {
        testing::Message::Message(&local_180);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3522ad);
        testing::internal::AssertHelper::AssertHelper
                  (&local_188,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x29b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_188,&local_180);
        testing::internal::AssertHelper::~AssertHelper(&local_188);
        testing::Message::~Message((Message *)0x352310);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x352365);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffc18);
      local_a8 = (char *)0x0;
    }
  }
  if (local_14 == 0) {
    local_14 = CfdGetConfidentialTxInPeginWitness
                         (in_stack_00000018,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                          unaff_retaddr);
    local_19c = 0;
    in_stack_fffffffffffffca8 = &local_198;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc28,
               (char *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
               in_stack_fffffffffffffc18,(int *)in_stack_fffffffffffffc10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffca8);
    if (!bVar1) {
      testing::Message::Message(&local_1a8);
      in_stack_fffffffffffffca0 =
           (char **)testing::AssertionResult::failure_message((AssertionResult *)0x352467);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x2a3,(char *)in_stack_fffffffffffffca0);
      testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
      testing::internal::AssertHelper::~AssertHelper(&local_1b0);
      testing::Message::~Message((Message *)0x3524ca);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x35251f);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_1c0,
                 "\"06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f\"","stack_data"
                 ,"06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f",local_a8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c0);
      if (!bVar1) {
        testing::Message::Message(&local_1c8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3525ce);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x2a5,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1d0);
        testing::Message::~Message((Message *)0x352631);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x352686);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffc18);
      local_a8 = (char *)0x0;
    }
  }
  if (local_14 == 0) {
    local_14 = CfdGetConfidentialTxInPeginWitness
                         (in_stack_00000018,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                          unaff_retaddr);
    local_1e4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc28,
               (char *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
               in_stack_fffffffffffffc18,(int *)in_stack_fffffffffffffc10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e0);
    if (!bVar1) {
      testing::Message::Message(&local_1f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x35277c);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x2ae,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::Message::~Message((Message *)0x3527d9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x35282e);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_208,"\"001412dcdeef890f60967896391c95b0e02c9258dfe5\"",
                 "stack_data","001412dcdeef890f60967896391c95b0e02c9258dfe5",local_a8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_208);
      if (!bVar1) {
        testing::Message::Message(&local_210);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3528d1);
        testing::internal::AssertHelper::AssertHelper
                  (&local_218,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x2b0,pcVar2);
        testing::internal::AssertHelper::operator=(&local_218,&local_210);
        testing::internal::AssertHelper::~AssertHelper(&local_218);
        testing::Message::~Message((Message *)0x35292e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x352983);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffc18);
      local_a8 = (char *)0x0;
    }
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffc48);
  if (local_14 != 0) {
    local_220 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    local_234 = 0;
    pAVar3 = &local_230;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc28,
               (char *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
               in_stack_fffffffffffffc18,(int *)in_stack_fffffffffffffc10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
    if (!bVar1) {
      testing::Message::Message(&local_240);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x352a8b);
      testing::internal::AssertHelper::AssertHelper
                (&local_248,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x2ba,pcVar2);
      testing::internal::AssertHelper::operator=(&local_248,&local_240);
      testing::internal::AssertHelper::~AssertHelper(&local_248);
      testing::Message::~Message((Message *)0x352ae8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x352b3d);
    testing::internal::CmpHelperSTREQ((internal *)&local_258,"\"\"","str_buffer","",local_220);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_258);
    if (!bVar1) {
      testing::Message::Message(&local_260);
      in_stack_fffffffffffffc28 =
           (void **)testing::AssertionResult::failure_message((AssertionResult *)0x352bd2);
      testing::internal::AssertHelper::AssertHelper
                (&local_268,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,699,(char *)in_stack_fffffffffffffc28);
      testing::internal::AssertHelper::operator=(&local_268,&local_260);
      testing::internal::AssertHelper::~AssertHelper(&local_268);
      testing::Message::~Message((Message *)0x352c2f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x352c84);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffc18);
    local_220 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffc18);
  local_27c = 0;
  pAVar3 = &local_278;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffc28,
             (char *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
             (CfdErrorCode *)pAVar3,(int *)in_stack_fffffffffffffc10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x352d54);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x2c1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_290,&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    testing::Message::~Message((Message *)0x352db1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x352e06);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, GetPeginWitnessData) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  static const char* tx_data = "0200000001017926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f30000004000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000002540ba97c0017a91414b71442e11941fd7807a82eabee13d6ec171ed9870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000003a84000000000000000000060800e40b54020000002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f16001412dcdeef890f60967896391c95b0e02c9258dfe5fdda060200000000010a945efd42ce42de413aa7398a95c35facc14ec5d35bb23e5f980014e94ab96a620000000017160014ca2041536307bbe086e8c7fe8563e1c9b9b6eb84feffffffe50b46ecadb5cc52a7ef149a23323464353415f02d7b4a943963b26a9beb2a030000000017160014ca2041536307bbe086e8c7fe8563e1c9b9b6eb84feffffff67173609ca4c13662356a2507c71e5d497baeff56a3c42af989f3b270bc870560000000017160014ca2041536307bbe086e8c7fe8563e1c9b9b6eb84feffffff784a9fd151fe2808949fae18afcf52244a77702b9a83950bc7ec52a8239104850000000017160014ca2041536307bbe086e8c7fe8563e1c9b9b6eb84feffffff259618278cecbae1bed8b7806133d14987c3c6118d2744707f509c58ea2c0e870000000017160014ca2041536307bbe086e8c7fe8563e1c9b9b6eb84feffffff5c30c2fdcb6ce0b666120777ec18ce5211dd4741f40f033648432694b0919da50000000017160014a8a7c0032d1d283e39889861b3f05156e379cfb6feffffffbb0f857d4b143c74c7fdb678bf41b65e7e3f2e7644b3613ae6370d21c0882ad60000000017160014a8a7c0032d1d283e39889861b3f05156e379cfb6feffffffbce488c283e07bf364edb5057e020aa3d137d8d6130711dc12f03f35564945680000000017160014ca2041536307bbe086e8c7fe8563e1c9b9b6eb84feffffff258cb927989780ac92a3952ffd1f54e9b65e59fb07219eb106840b5d76b547fb0000000017160014ca2041536307bbe086e8c7fe8563e1c9b9b6eb84feffffffe98ec686efbca9bdd18ae85a3a8235a607e1cfb6138bac1461d400cbbabbe00f0000000017160014a8a7c0032d1d283e39889861b3f05156e379cfb6feffffff0100e40b540200000017a91472c44f957fc011d97e3406667dca5b1c930c4026870247304402206b4de54956e864dfe3ff3a4957e329cf171e919498bb8f98c242bef7b0d5e3350220505355401a500aabf193b93492d6bceb93c3b183034f252d65a139245c7486a601210281465587e09d80f5a7b8ce94bab4a4571dc8cff4483cc9eb89e76ecfa650b6f40247304402200fc48c7b5bd6de74c951250c60e8e6c9d3a605dc557bdc93ce86e85d2f27834a02205d2a8768adad669683416d1126c8537ab1eb36b0e83d5d9e6a583297b7f9d2cb01210281465587e09d80f5a7b8ce94bab4a4571dc8cff4483cc9eb89e76ecfa650b6f40247304402207ad97500fbe6049d559a1e10586cd0b1f02baeb98dc641a971a506a57288aa0002202a6646bc4262904f6d1a9288c12ff586b5a674f5a351dfaba2698c8b8265366f01210281465587e09d80f5a7b8ce94bab4a4571dc8cff4483cc9eb89e76ecfa650b6f4024730440220271e41a1e8f953b6817333e43d6a5e2924b291d52120011a5f7f1fb8049ae41b02200f1a25ed9da813122caadf8edf8d01da190f9407c2b61c27d4b671e07136bce701210281465587e09d80f5a7b8ce94bab4a4571dc8cff4483cc9eb89e76ecfa650b6f402473044022050291184dcd4733de6e6a43d9efb1e21e7d2c563e9138481f04010f3acbb139f02206c01c3bfe4e5b71c4aac524a18f35e25ae7306ca110b3c3b079ae6da2b0a0a5701210281465587e09d80f5a7b8ce94bab4a4571dc8cff4483cc9eb89e76ecfa650b6f402473044022045a188c10aec4f1a3a6c8a3a3c9f7d4dc63b9eacc011839c907d1c5da206a1390220399ca60516204efd9d220eaa0c804867137133c4d70780223fdde699288af3790121031c01fd031bc09b385d138b3b2f44ec04c03934b66f6485f37a17b4899f1b8d7802473044022053621a5c74b313c648d179041c154152372060941d9c9080340eb913358b705602201ac178f639360356ca7d75656d92bd7801d976e74bd5d2e30d6310a94940d0bc0121031c01fd031bc09b385d138b3b2f44ec04c03934b66f6485f37a17b4899f1b8d780247304402207b4a7a271a8fc03e8045ca367cb64046fa06e5b13a105e67efe7dd6571503fcb022072852e1c3f87eeac039601a0df855fb5d65bbdcd3ad95ff96bfc7b534fd89f7601210281465587e09d80f5a7b8ce94bab4a4571dc8cff4483cc9eb89e76ecfa650b6f402473044022037e9f0943a79e155a57526e251cfd39e004552b76c0de892448eb939d2d12fdf02203a02f0045e8f90739eddc06c026c95b4a653aeb89528d851ab75952fd7db07b801210281465587e09d80f5a7b8ce94bab4a4571dc8cff4483cc9eb89e76ecfa650b6f402473044022057a9953ba83d5e710fc64e1c533d81b0913f434b3e1c865cebd6cb106e09fa77022012930afe63ae7f1115a2f3b13039e71387fc2d4ed0e36eaa7be55a754c8c84830121031c01fd031bc09b385d138b3b2f44ec04c03934b66f6485f37a17b4899f1b8d78130e00009700000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f3010500000000";

  uint32_t pegin_count = 0;
  char* stack_data = nullptr;

  ret = CfdGetConfidentialTxInPeginWitnessCount(handle, tx_data, 0, &pegin_count);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_EQ(6, pegin_count);

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxInPeginWitness(
        handle, tx_data, 0, 0, &stack_data);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("00e40b5402000000", stack_data);
      CfdFreeStringBuffer(stack_data);
      stack_data = nullptr;
    }
  }
  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxInPeginWitness(
        handle, tx_data, 0, 0, &stack_data);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("00e40b5402000000", stack_data);
      CfdFreeStringBuffer(stack_data);
      stack_data = nullptr;
    }
  }
  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxInPeginWitness(
        handle, tx_data, 0, 2, &stack_data);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f", stack_data);
      CfdFreeStringBuffer(stack_data);
      stack_data = nullptr;
    }
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxInPeginWitness(
        handle, tx_data, 0, 3, &stack_data);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("001412dcdeef890f60967896391c95b0e02c9258dfe5", stack_data);
      CfdFreeStringBuffer(stack_data);
      stack_data = nullptr;
    }
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}